

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Name __thiscall wasm::makeHighName(wasm *this,Name n)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  Name n_local;
  
  n_local.super_IString.str._M_len = n.super_IString.str._M_len;
  local_28 = (undefined1  [8])this;
  IString::toString_abi_cxx11_(&local_68,(IString *)local_28);
  std::operator+(&local_48,&local_68,"$hi");
  Name::Name((Name *)&n_local.super_IString.str._M_str,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return (IString)(IString)stack0xffffffffffffffe8;
}

Assistant:

static Name makeHighName(Name n) { return n.toString() + "$hi"; }